

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createFullscreenQuad(void)

{
  vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>> *in_RDI;
  Vertex4Tex4 vertices [6];
  allocator_type local_169;
  Vertex4Tex4 local_168;
  Vertex4Tex4 local_148;
  Vertex4Tex4 local_128;
  Vertex4Tex4 local_108;
  Vertex4Tex4 local_e8;
  Vertex4Tex4 local_c8;
  undefined1 *local_a8;
  float afStack_a0 [2];
  undefined1 *local_98;
  float afStack_90 [2];
  Vertex4Tex4 local_88;
  Vertex4Tex4 local_68;
  Vertex4Tex4 local_48;
  
  local_48.position.m_data[0] = -1.0;
  local_48.position.m_data[1] = -1.0;
  local_48.position.m_data[2] = 0.0;
  local_48.position.m_data[3] = 1.0;
  local_48.texCoord.m_data[0] = 0.0;
  local_48.texCoord.m_data[1] = 0.0;
  local_48.texCoord.m_data[2] = 0.0;
  local_48.texCoord.m_data[3] = 0.0;
  local_68.position.m_data[0] = -1.0;
  local_68.position.m_data[1] = 1.0;
  local_68.position.m_data[2] = 0.0;
  local_68.position.m_data[3] = 1.0;
  local_68.texCoord.m_data[0] = 0.0;
  local_68.texCoord.m_data[1] = 1.0;
  local_68.texCoord.m_data[2] = 0.0;
  local_68.texCoord.m_data[3] = 0.0;
  local_88.position.m_data[0] = 1.0;
  local_88.position.m_data[1] = -1.0;
  local_88.position.m_data[2] = 0.0;
  local_88.position.m_data[3] = 1.0;
  local_88.texCoord.m_data[0] = 1.0;
  local_88.texCoord.m_data[1] = 0.0;
  local_88.texCoord.m_data[2] = 0.0;
  local_88.texCoord.m_data[3] = 0.0;
  local_a8 = &DAT_3f8000003f800000;
  afStack_a0[0] = 0.0;
  afStack_a0[1] = 1.0;
  local_98 = &DAT_3f8000003f800000;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  Vertex4Tex4::Vertex4Tex4(&local_168,&local_48);
  Vertex4Tex4::Vertex4Tex4(&local_148,&local_88);
  Vertex4Tex4::Vertex4Tex4(&local_128,&local_68);
  Vertex4Tex4::Vertex4Tex4(&local_108,&local_68);
  Vertex4Tex4::Vertex4Tex4(&local_e8,&local_88);
  Vertex4Tex4::Vertex4Tex4(&local_c8,(Vertex4Tex4 *)&local_a8);
  std::vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>>::
  vector<vkt::pipeline::Vertex4Tex4_const*,void>
            (in_RDI,&local_168,(Vertex4Tex4 *)&local_a8,&local_169);
  return (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createFullscreenQuad (void)
{
	using tcu::Vec4;

	const Vertex4Tex4 lowerLeftVertex =
	{
		Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperLeftVertex =
	{
		Vec4(-1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 1.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 lowerRightVertex =
	{
		Vec4(1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperRightVertex =
	{
		Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 1.0f, 0.0f, 0.0f)
	};

	const Vertex4Tex4 vertices[6] =
	{
		lowerLeftVertex,
		lowerRightVertex,
		upperLeftVertex,

		upperLeftVertex,
		lowerRightVertex,
		upperRightVertex
	};

	return std::vector<Vertex4Tex4>(vertices, vertices + DE_LENGTH_OF_ARRAY(vertices));
}